

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Ehdr *x)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  Elf64_Half local_22;
  ELF_Ehdr *pEStack_20;
  ELF_Half et;
  ELF_Ehdr *x_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  pEStack_20 = x;
  x_local = (ELF_Ehdr *)this;
  plVar2 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  uVar3 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((uVar3 & 1) == 0) {
    local_22 = pEStack_20->e_type;
    if (((this->super_cmELFInternal).NeedSwap & 1U) != 0) {
      cmELFByteSwap<unsigned_short>(&local_22);
    }
    bVar1 = FileTypeValid(this,local_22);
    if (!bVar1) {
      cmELFByteSwap<unsigned_short>(&local_22);
      bVar1 = FileTypeValid(this,local_22);
      if (bVar1) {
        (this->super_cmELFInternal).NeedSwap =
             (bool)(((this->super_cmELFInternal).NeedSwap ^ 0xffU) & 1);
      }
    }
    if (((this->super_cmELFInternal).NeedSwap & 1U) != 0) {
      ByteSwap(this,pEStack_20);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(ELF_Ehdr& x)
    {
    // Read the header from the file.
    if(!this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x)))
      {
      return false;
      }

    // The byte order of ELF header fields may not match that of the
    // processor-specific data.  The header fields are ordered to
    // match the target execution environment, so we may need to
    // memorize the order of all platforms based on the e_machine
    // value.  As a heuristic, if the type is invalid but its
    // swapped value is okay then flip our swap mode.
    ELF_Half et = x.e_type;
    if(this->NeedSwap)
      {
      cmELFByteSwap(et);
      }
    if(!this->FileTypeValid(et))
      {
      cmELFByteSwap(et);
      if(this->FileTypeValid(et))
        {
        // The previous byte order guess was wrong.  Flip it.
        this->NeedSwap = !this->NeedSwap;
        }
      }

    // Fix the byte order of the header.
    if(this->NeedSwap)
      {
      ByteSwap(x);
      }
    return true;
    }